

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::FuncExpr::FuncExpr
          (FuncExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,TemplateDecls *templs,
          vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
          *params,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *returnExpr,
          unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *body,
          bool autoDetectReturnType)

{
  bool bVar1;
  byte local_49;
  bool autoDetectReturnType_local;
  TemplateDecls *templs_local;
  Token *tokId_local;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Position *pos_local;
  Lexer *lexer_local;
  FuncExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_FUNC,pos);
  Capable::Capable(&this->super_Capable,caps);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__FuncExpr_0017f790;
  this->tokId = tokId;
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::vector(&this->templs,templs);
  std::
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ::vector(&this->params,params);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            (&this->returnExpr,returnExpr);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::unique_ptr
            (&this->body,body);
  this->autoDetectReturnType = autoDetectReturnType;
  if (this->tokId == (Token *)0x0) {
    __assert_fail("this->tokId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0xcb,
                  "pfederc::FuncExpr::FuncExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::vector<std::unique_ptr<FuncParameter>> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&, bool)"
                 );
  }
  if ((this->autoDetectReturnType & 1U) != 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->returnExpr);
    local_49 = 1;
    if (!bVar1) goto LAB_0014c36b;
  }
  local_49 = this->autoDetectReturnType ^ 0xff;
LAB_0014c36b:
  if ((local_49 & 1) != 0) {
    _setTemplateParents(&this->templs,&this->super_Expr);
    _setParameterParents(&this->params,&this->super_Expr);
    _setParent<pfederc::Expr>(&this->returnExpr,&this->super_Expr);
    _setParent<pfederc::BodyExpr>(&this->body,&this->super_Expr);
    return;
  }
  __assert_fail("(this->autoDetectReturnType && !this->returnExpr) || !this->autoDetectReturnType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0xcc,
                "pfederc::FuncExpr::FuncExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::vector<std::unique_ptr<FuncParameter>> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&, bool)"
               );
}

Assistant:

FuncExpr::FuncExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId,
    TemplateDecls &&templs,
    std::vector<std::unique_ptr<FuncParameter>> &&params,
    std::unique_ptr<Expr> &&returnExpr,
    std::unique_ptr<BodyExpr> &&body,
    bool autoDetectReturnType) noexcept
    : Expr(lexer, ExprType::EXPR_FUNC, pos), Capable(std::move(caps)), tokId{tokId},
      templs(std::move(templs)), params(std::move(params)),
      returnExpr(std::move(returnExpr)), body(std::move(body)),
      autoDetectReturnType{autoDetectReturnType} {
  assert(this->tokId);
  assert((this->autoDetectReturnType && !this->returnExpr) || !this->autoDetectReturnType);

  _setTemplateParents(this->templs, this);
  _setParameterParents(this->params, this);
  _setParent(this->returnExpr, this);
  _setParent(this->body, this);
}